

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR lyd_any_copy_value(lyd_node *trg,lyd_any_value *value,LYD_ANYDATA_VALUETYPE value_type)

{
  long lVar1;
  LY_ERR LVar2;
  int iVar3;
  void *pvVar4;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_48;
  int len;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_node_any *t;
  LYD_ANYDATA_VALUETYPE value_type_local;
  lyd_any_value *value_local;
  lyd_node *trg_local;
  
  if (trg == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","trg","lyd_any_copy_value"
          );
    return LY_EINVAL;
  }
  if (trg->schema == (lysc_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","trg->schema",
           "lyd_any_copy_value");
    return LY_EINVAL;
  }
  if ((trg->schema->nodetype & 0x60) == 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "trg->schema->nodetype & 0x0060","lyd_any_copy_value");
    return LY_EINVAL;
  }
  iVar3 = *(int *)&trg[1].schema;
  if (iVar3 == 0) {
    lyd_free_all(*(lyd_node **)(trg + 1));
  }
  else if (iVar3 - 1U < 3) {
    if (trg->schema == (lysc_node *)0x0) {
      local_48 = (ly_ctx *)trg[2].schema;
    }
    else {
      local_48 = trg->schema->module->ctx;
    }
    lydict_remove(local_48,*(char **)(trg + 1));
  }
  else if (iVar3 == 4) {
    free(*(void **)(trg + 1));
  }
  trg[1].hash = 0;
  trg[1].flags = 0;
  if (value == (lyd_any_value *)0x0) {
    return LY_SUCCESS;
  }
  *(LYD_ANYDATA_VALUETYPE *)&trg[1].schema = value_type;
  if (value_type == LYD_ANYDATA_DATATREE) {
    if (value->tree == (lyd_node *)0x0) {
      return LY_SUCCESS;
    }
    LVar2 = lyd_dup_siblings(value->tree,(lyd_node_inner *)0x0,1,(lyd_node **)(trg + 1));
  }
  else {
    if (2 < value_type - LYD_ANYDATA_STRING) {
      if (value_type != LYD_ANYDATA_LYB) {
        return LY_SUCCESS;
      }
      if (value->tree == (lyd_node *)0x0) {
        return LY_SUCCESS;
      }
      iVar3 = lyd_lyb_data_length(value->str);
      if (iVar3 == -1) {
        return LY_EINVAL;
      }
      pvVar4 = malloc((long)iVar3);
      *(void **)(trg + 1) = pvVar4;
      lVar1._0_4_ = trg[1].hash;
      lVar1._4_4_ = trg[1].flags;
      if (lVar1 != 0) {
        memcpy(*(void **)(trg + 1),value->tree,(long)iVar3);
        return LY_SUCCESS;
      }
      if (trg->schema == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)trg[2].schema;
      }
      else {
        local_60 = trg->schema->module->ctx;
      }
      ly_log(local_60,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_any_copy_value");
      return LY_EMEM;
    }
    if (value->tree == (lyd_node *)0x0) {
      return LY_SUCCESS;
    }
    if (trg->schema == (lysc_node *)0x0) {
      local_58 = (ly_ctx *)trg[2].schema;
    }
    else {
      local_58 = trg->schema->module->ctx;
    }
    LVar2 = lydict_insert(local_58,value->str,0,(char **)(trg + 1));
  }
  if (LVar2 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_any_copy_value(struct lyd_node *trg, const union lyd_any_value *value, LYD_ANYDATA_VALUETYPE value_type)
{
    struct lyd_node_any *t;

    LY_CHECK_ARG_RET(NULL, trg, LY_EINVAL);
    LY_CHECK_ARG_RET(NULL, trg->schema, trg->schema->nodetype & LYS_ANYDATA, LY_EINVAL);

    t = (struct lyd_node_any *)trg;

    /* free trg */
    switch (t->value_type) {
    case LYD_ANYDATA_DATATREE:
        lyd_free_all(t->value.tree);
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_XML:
    case LYD_ANYDATA_JSON:
        lydict_remove(LYD_CTX(trg), t->value.str);
        break;
    case LYD_ANYDATA_LYB:
        free(t->value.mem);
        break;
    }
    t->value.str = NULL;

    if (!value) {
        /* only free value in this case */
        return LY_SUCCESS;
    }

    /* copy src */
    t->value_type = value_type;
    switch (value_type) {
    case LYD_ANYDATA_DATATREE:
        if (value->tree) {
            LY_CHECK_RET(lyd_dup_siblings(value->tree, NULL, LYD_DUP_RECURSIVE, &t->value.tree));
        }
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_XML:
    case LYD_ANYDATA_JSON:
        if (value->str) {
            LY_CHECK_RET(lydict_insert(LYD_CTX(trg), value->str, 0, &t->value.str));
        }
        break;
    case LYD_ANYDATA_LYB:
        if (value->mem) {
            int len = lyd_lyb_data_length(value->mem);

            LY_CHECK_RET(len == -1, LY_EINVAL);
            t->value.mem = malloc(len);
            LY_CHECK_ERR_RET(!t->value.mem, LOGMEM(LYD_CTX(trg)), LY_EMEM);
            memcpy(t->value.mem, value->mem, len);
        }
        break;
    }

    return LY_SUCCESS;
}